

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::SkipByteOrderMark(Parser *this)

{
  string *in_RSI;
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [40];
  Parser *this_local;
  
  this_local = this;
  if (*(char *)in_RSI->_M_string_length == -0x11) {
    in_RSI->_M_string_length = in_RSI->_M_string_length + 1;
    if (*(char *)in_RSI->_M_string_length == -0x45) {
      in_RSI->_M_string_length = in_RSI->_M_string_length + 1;
      if (*(char *)in_RSI->_M_string_length == -0x41) {
        in_RSI->_M_string_length = in_RSI->_M_string_length + 1;
        anon_unknown_0::NoError();
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_70,"invalid utf-8 byte order mark",&local_71);
        Error(this,in_RSI);
        std::__cxx11::string::~string(local_70);
        std::allocator<char>::~allocator(&local_71);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_38,"invalid utf-8 byte order mark",&local_39);
      Error(this,in_RSI);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator(&local_39);
    }
  }
  else {
    anon_unknown_0::NoError();
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::SkipByteOrderMark() {
  if (static_cast<unsigned char>(*cursor_) != 0xef) return NoError();
  cursor_++;
  if (static_cast<unsigned char>(*cursor_) != 0xbb)
    return Error("invalid utf-8 byte order mark");
  cursor_++;
  if (static_cast<unsigned char>(*cursor_) != 0xbf)
    return Error("invalid utf-8 byte order mark");
  cursor_++;
  return NoError();
}